

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

bool tinyexr::hufUnpackEncTable(char **pcode,int ni,int im,int iM,longlong *hcode)

{
  longlong lVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  void *in_R8;
  int zerun_1;
  int zerun;
  longlong l;
  int lc;
  longlong c;
  char *p;
  longlong *in_stack_00000130;
  int local_50;
  int local_4c;
  int local_3c;
  longlong local_38;
  char *local_30;
  void *local_28;
  int local_1c;
  int local_18;
  int local_14;
  long *local_10;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  memset(in_R8,0,0x80008);
  local_30 = (char *)*local_10;
  local_38 = 0;
  local_3c = 0;
  do {
    if (local_1c < local_18) {
      *local_10 = (long)local_30;
      hufCanonicalCodeTable(in_stack_00000130);
      return true;
    }
    if ((long)local_14 <= (long)local_30 - *local_10) {
      return false;
    }
    lVar1 = getBits(6,&local_38,&local_3c,&local_30);
    *(longlong *)((long)local_28 + (long)local_18 * 8) = lVar1;
    if (lVar1 == 0x3f) {
      if ((long)local_14 < (long)local_30 - *local_10) {
        return false;
      }
      lVar1 = getBits(8,&local_38,&local_3c,&local_30);
      local_4c = (int)lVar1 + 6;
      if (local_1c + 1 < local_18 + local_4c) {
        return false;
      }
      while (local_4c != 0) {
        *(undefined8 *)((long)local_28 + (long)local_18 * 8) = 0;
        local_4c = local_4c + -1;
        local_18 = local_18 + 1;
      }
      local_18 = local_18 + -1;
    }
    else if (0x3a < lVar1) {
      local_50 = (int)lVar1 + -0x39;
      if (local_1c + 1 < local_18 + local_50) {
        return false;
      }
      while (local_50 != 0) {
        *(undefined8 *)((long)local_28 + (long)local_18 * 8) = 0;
        local_50 = local_50 + -1;
        local_18 = local_18 + 1;
      }
      local_18 = local_18 + -1;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

static bool hufUnpackEncTable(
    const char **pcode,  // io: ptr to packed table (updated)
    int ni,              // i : input size (in bytes)
    int im,              // i : min hcode index
    int iM,              // i : max hcode index
    long long *hcode)    //  o: encoding table [HUF_ENCSIZE]
{
  memset(hcode, 0, sizeof(long long) * HUF_ENCSIZE);

  const char *p = *pcode;
  long long c = 0;
  int lc = 0;

  for (; im <= iM; im++) {
    if (p - *pcode >= ni) {
      return false;
    }

    long long l = hcode[im] = getBits(6, c, lc, p);  // code length

    if (l == (long long)LONG_ZEROCODE_RUN) {
      if (p - *pcode > ni) {
        return false;
      }

      int zerun = getBits(8, c, lc, p) + SHORTEST_LONG_RUN;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    } else if (l >= (long long)SHORT_ZEROCODE_RUN) {
      int zerun = l - SHORT_ZEROCODE_RUN + 2;

      if (im + zerun > iM + 1) {
        return false;
      }

      while (zerun--) hcode[im++] = 0;

      im--;
    }
  }

  *pcode = const_cast<char *>(p);

  hufCanonicalCodeTable(hcode);

  return true;
}